

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandEnlarge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nFrames;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nFrames = 5;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Fvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else {
        if (pAVar2->nObjCounts[8] == 0) {
          pcVar3 = "The network is combinational.\n";
LAB_0024056a:
          Abc_Print(-1,pcVar3);
          return 0;
        }
        if (pAVar2->ntkType != ABC_NTK_STRASH) {
          pcVar3 = "Currently only works for structurally hashed circuits.\n";
          goto LAB_0024056a;
        }
        pAVar2 = Abc_NtkDarEnlarge(pAVar2,nFrames,fVerbose);
        if (pAVar2 != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
          return 0;
        }
        pcVar3 = "Target enlargement has failed.\n";
      }
      iVar4 = -1;
      goto LAB_00240601;
    }
    if (iVar1 != 0x46) goto LAB_00240599;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_00240599;
    }
    nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nFrames < 1) {
LAB_00240599:
      iVar4 = -2;
      Abc_Print(-2,"usage: enlarge [-F <num>] [-vh]\n");
      Abc_Print(-2,"\t           performs structural K-step target enlargement\n");
      Abc_Print(-2,"\t-F <num> : the number of timeframes to unroll (<num> > 0) [default = %d]\n",
                (ulong)nFrames);
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "\t-h       : print the command usage\n";
LAB_00240601:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandEnlarge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nFrames;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarEnlarge( Abc_Ntk_t * pNtk, int nFrames, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nFrames      = 5;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 1 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }

    // modify the current network
    pNtkRes = Abc_NtkDarEnlarge( pNtk, nFrames, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Target enlargement has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;
usage:
    Abc_Print( -2, "usage: enlarge [-F <num>] [-vh]\n" );
    Abc_Print( -2, "\t           performs structural K-step target enlargement\n" );
    Abc_Print( -2, "\t-F <num> : the number of timeframes to unroll (<num> > 0) [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}